

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::EntryPointInfo::Finalize(EntryPointInfo *this,bool isShutdown)

{
  StackBackTrace *obj;
  undefined7 in_register_00000031;
  
  ExpirableObject::Finalize((ExpirableObject *)this,isShutdown);
  if ((int)CONCAT71(in_register_00000031,isShutdown) == 0) {
    (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])(this);
  }
  this->cleanupReason = CleanUpForFinalize;
  Cleanup(this,isShutdown,false);
  obj = this->cleanupStack;
  if (obj != (StackBackTrace *)0x0) {
    Memory::
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,obj,
               (ulong)obj->requestedFramesToCapture << 3);
    this->cleanupStack = (Type)0x0;
  }
  (this->library).ptr = (JavascriptLibrary *)0x0;
  return;
}

Assistant:

void EntryPointInfo::Finalize(bool isShutdown)
    {
        __super::Finalize(isShutdown);

        if (!isShutdown)
        {
            ReleasePendingWorkItem();
        }

#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
        this->SetCleanupReason(CleanupReason::CleanUpForFinalize);
#endif

        this->Cleanup(isShutdown, false);

#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
#if ENABLE_DEBUG_STACK_BACK_TRACE
        if (this->cleanupStack != nullptr)
        {
            this->cleanupStack->Delete(&NoCheckHeapAllocator::Instance);
            this->cleanupStack = nullptr;
        }
#endif
#endif

        this->library = nullptr;
    }